

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O0

bool __thiscall CaptureSummary::AddLine(CaptureSummary *this,CaptureLine *line,bool need_allocation)

{
  CaptureLine *local_28;
  CaptureLine *new_line;
  bool ret;
  CaptureLine *pCStack_18;
  bool need_allocation_local;
  CaptureLine *line_local;
  CaptureSummary *this_local;
  
  new_line._6_1_ = 1;
  local_28 = line;
  new_line._7_1_ = need_allocation;
  pCStack_18 = line;
  line_local = (CaptureLine *)this;
  if (need_allocation) {
    local_28 = (CaptureLine *)operator_new(0xd0);
    if (local_28 == (CaptureLine *)0x0) {
      new_line._6_1_ = 0;
    }
    else {
      memcpy(local_28,pCStack_18,0xd0);
    }
  }
  if ((new_line._6_1_ & 1) != 0) {
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::push_back
              (&this->summary,&local_28);
  }
  return (bool)(new_line._6_1_ & 1);
}

Assistant:

bool CaptureSummary::AddLine(CaptureLine * line, bool need_allocation)
{
    bool ret = true;
    CaptureLine * new_line;

    if (need_allocation)
    {
        new_line = new CaptureLine;

        if (new_line == NULL)
        {
            ret = false;
        }
        else
        {
            memcpy(new_line, line, sizeof(CaptureLine));
        }
    }
    else
    {
        new_line = line;
    }

    if (ret)
    {
        summary.push_back(new_line);
    }

    return ret;
}